

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O2

int png_set_text_2(png_const_structrp png_ptr,png_inforp info_ptr,png_const_textp text_ptr,
                  int num_text)

{
  byte *pbVar1;
  uint old_elements;
  png_textp ppVar2;
  size_t sVar3;
  size_t __n;
  size_t __n_00;
  png_charp pcVar4;
  char *pcVar5;
  int iVar6;
  png_charp *ppcVar7;
  long lVar8;
  size_t local_58;
  
  if (text_ptr == (png_const_textp)0x0) {
    return 0;
  }
  if (png_ptr == (png_const_structrp)0x0) {
    return 0;
  }
  if (info_ptr == (png_inforp)0x0) {
    return 0;
  }
  if (num_text < 1) {
    return 0;
  }
  old_elements = info_ptr->num_text;
  if ((int)(info_ptr->max_text - old_elements) < num_text) {
    if ((uint)num_text <= (old_elements ^ 0x7fffffff)) {
      iVar6 = 0x7fffffff;
      if ((int)(old_elements + num_text) < 0x7ffffff7) {
        iVar6 = (old_elements + num_text & 0xfffffff8) + 8;
      }
      ppVar2 = (png_textp)
               png_realloc_array(png_ptr,info_ptr->text,old_elements,iVar6 - old_elements,0x38);
      if (ppVar2 != (png_textp)0x0) {
        png_free(png_ptr,info_ptr->text);
        info_ptr->text = ppVar2;
        pbVar1 = (byte *)((long)&info_ptr->free_me + 1);
        *pbVar1 = *pbVar1 | 0x40;
        info_ptr->max_text = iVar6;
        goto LAB_0011b513;
      }
    }
    pcVar5 = "too many text chunks";
LAB_0011b751:
    iVar6 = 1;
    png_chunk_report(png_ptr,pcVar5,1);
  }
  else {
LAB_0011b513:
    for (lVar8 = 0; (ulong)(uint)num_text * 0x38 != lVar8; lVar8 = lVar8 + 0x38) {
      pcVar5 = *(char **)((long)&text_ptr->key + lVar8);
      if (pcVar5 != (char *)0x0) {
        iVar6 = *(int *)((long)&text_ptr->compression + lVar8);
        if (iVar6 - 3U < 0xfffffffc) {
          png_chunk_report(png_ptr,"text compression mode is out of range",1);
        }
        else {
          ppVar2 = info_ptr->text + info_ptr->num_text;
          sVar3 = strlen(pcVar5);
          if (iVar6 < 1) {
            local_58 = 0;
LAB_0011b5cb:
            __n = 0;
          }
          else {
            pcVar5 = *(char **)((long)&text_ptr->lang + lVar8);
            if (pcVar5 == (char *)0x0) {
              local_58 = 0;
            }
            else {
              local_58 = strlen(pcVar5);
            }
            pcVar5 = *(char **)((long)&text_ptr->lang_key + lVar8);
            if (pcVar5 == (char *)0x0) goto LAB_0011b5cb;
            __n = strlen(pcVar5);
          }
          pcVar5 = *(char **)((long)&text_ptr->text + lVar8);
          if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
            iVar6 = (uint)(0 < iVar6) * 2 + -1;
            __n_00 = 0;
          }
          else {
            __n_00 = strlen(pcVar5);
          }
          ppVar2->compression = iVar6;
          pcVar4 = (png_charp)png_malloc_base(png_ptr,__n_00 + local_58 + sVar3 + __n + 4);
          ppVar2->key = pcVar4;
          if (pcVar4 == (png_charp)0x0) {
            pcVar5 = "text chunk: out of memory";
            goto LAB_0011b751;
          }
          ppcVar7 = &ppVar2->key;
          memcpy(pcVar4,*(void **)((long)&text_ptr->key + lVar8),sVar3);
          (*ppcVar7)[sVar3] = '\0';
          if (*(int *)((long)&text_ptr->compression + lVar8) < 1) {
            ppVar2->lang = (png_charp)0x0;
            ppVar2->lang_key = (png_charp)0x0;
          }
          else {
            ppVar2->lang = ppVar2->key + sVar3 + 1;
            memcpy(ppVar2->key + sVar3 + 1,*(void **)((long)&text_ptr->lang + lVar8),local_58);
            ppVar2->lang[local_58] = '\0';
            ppcVar7 = &ppVar2->lang_key;
            ppVar2->lang_key = ppVar2->lang + local_58 + 1;
            memcpy(ppVar2->lang + local_58 + 1,*(void **)((long)&text_ptr->lang_key + lVar8),__n);
            ppVar2->lang_key[__n] = '\0';
            sVar3 = __n;
          }
          pcVar4 = *ppcVar7 + sVar3 + 1;
          ppVar2->text = pcVar4;
          if (__n_00 != 0) {
            memcpy(pcVar4,*(void **)((long)&text_ptr->text + lVar8),__n_00);
            pcVar4 = ppVar2->text;
          }
          pcVar4[__n_00] = '\0';
          if (ppVar2->compression < 1) {
            sVar3 = 0;
          }
          else {
            sVar3 = __n_00;
            __n_00 = 0;
          }
          ppVar2->text_length = __n_00;
          ppVar2->itxt_length = sVar3;
          info_ptr->num_text = info_ptr->num_text + 1;
        }
      }
    }
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int /* PRIVATE */
png_set_text_2(png_const_structrp png_ptr, png_inforp info_ptr,
    png_const_textp text_ptr, int num_text)
{
   int i;

   png_debug1(1, "in %lx storage function", png_ptr == NULL ? 0xabadca11U :
      (unsigned long)png_ptr->chunk_name);

   if (png_ptr == NULL || info_ptr == NULL || num_text <= 0 || text_ptr == NULL)
      return(0);

   /* Make sure we have enough space in the "text" array in info_struct
    * to hold all of the incoming text_ptr objects.  This compare can't overflow
    * because max_text >= num_text (anyway, subtract of two positive integers
    * can't overflow in any case.)
    */
   if (num_text > info_ptr->max_text - info_ptr->num_text)
   {
      int old_num_text = info_ptr->num_text;
      int max_text;
      png_textp new_text = NULL;

      /* Calculate an appropriate max_text, checking for overflow. */
      max_text = old_num_text;
      if (num_text <= INT_MAX - max_text)
      {
         max_text += num_text;

         /* Round up to a multiple of 8 */
         if (max_text < INT_MAX-8)
            max_text = (max_text + 8) & ~0x7;

         else
            max_text = INT_MAX;

         /* Now allocate a new array and copy the old members in; this does all
          * the overflow checks.
          */
         new_text = png_voidcast(png_textp,png_realloc_array(png_ptr,
             info_ptr->text, old_num_text, max_text-old_num_text,
             sizeof *new_text));
      }

      if (new_text == NULL)
      {
         png_chunk_report(png_ptr, "too many text chunks",
             PNG_CHUNK_WRITE_ERROR);

         return 1;
      }

      png_free(png_ptr, info_ptr->text);

      info_ptr->text = new_text;
      info_ptr->free_me |= PNG_FREE_TEXT;
      info_ptr->max_text = max_text;
      /* num_text is adjusted below as the entries are copied in */

      png_debug1(3, "allocated %d entries for info_ptr->text", max_text);
   }

   for (i = 0; i < num_text; i++)
   {
      size_t text_length, key_len;
      size_t lang_len, lang_key_len;
      png_textp textp = &(info_ptr->text[info_ptr->num_text]);

      if (text_ptr[i].key == NULL)
          continue;

      if (text_ptr[i].compression < PNG_TEXT_COMPRESSION_NONE ||
          text_ptr[i].compression >= PNG_TEXT_COMPRESSION_LAST)
      {
         png_chunk_report(png_ptr, "text compression mode is out of range",
             PNG_CHUNK_WRITE_ERROR);
         continue;
      }

      key_len = strlen(text_ptr[i].key);

      if (text_ptr[i].compression <= 0)
      {
         lang_len = 0;
         lang_key_len = 0;
      }

      else
#  ifdef PNG_iTXt_SUPPORTED
      {
         /* Set iTXt data */

         if (text_ptr[i].lang != NULL)
            lang_len = strlen(text_ptr[i].lang);

         else
            lang_len = 0;

         if (text_ptr[i].lang_key != NULL)
            lang_key_len = strlen(text_ptr[i].lang_key);

         else
            lang_key_len = 0;
      }
#  else /* iTXt */
      {
         png_chunk_report(png_ptr, "iTXt chunk not supported",
             PNG_CHUNK_WRITE_ERROR);
         continue;
      }
#  endif

      if (text_ptr[i].text == NULL || text_ptr[i].text[0] == '\0')
      {
         text_length = 0;
#  ifdef PNG_iTXt_SUPPORTED
         if (text_ptr[i].compression > 0)
            textp->compression = PNG_ITXT_COMPRESSION_NONE;

         else
#  endif
            textp->compression = PNG_TEXT_COMPRESSION_NONE;
      }

      else
      {
         text_length = strlen(text_ptr[i].text);
         textp->compression = text_ptr[i].compression;
      }

      textp->key = png_voidcast(png_charp,png_malloc_base(png_ptr,
          key_len + text_length + lang_len + lang_key_len + 4));

      if (textp->key == NULL)
      {
         png_chunk_report(png_ptr, "text chunk: out of memory",
             PNG_CHUNK_WRITE_ERROR);

         return 1;
      }

      png_debug2(2, "Allocated %lu bytes at %p in png_set_text",
          (unsigned long)(png_uint_32)
          (key_len + lang_len + lang_key_len + text_length + 4),
          textp->key);

      memcpy(textp->key, text_ptr[i].key, key_len);
      *(textp->key + key_len) = '\0';

      if (text_ptr[i].compression > 0)
      {
         textp->lang = textp->key + key_len + 1;
         memcpy(textp->lang, text_ptr[i].lang, lang_len);
         *(textp->lang + lang_len) = '\0';
         textp->lang_key = textp->lang + lang_len + 1;
         memcpy(textp->lang_key, text_ptr[i].lang_key, lang_key_len);
         *(textp->lang_key + lang_key_len) = '\0';
         textp->text = textp->lang_key + lang_key_len + 1;
      }

      else
      {
         textp->lang=NULL;
         textp->lang_key=NULL;
         textp->text = textp->key + key_len + 1;
      }

      if (text_length != 0)
         memcpy(textp->text, text_ptr[i].text, text_length);

      *(textp->text + text_length) = '\0';

#  ifdef PNG_iTXt_SUPPORTED
      if (textp->compression > 0)
      {
         textp->text_length = 0;
         textp->itxt_length = text_length;
      }

      else
#  endif
      {
         textp->text_length = text_length;
         textp->itxt_length = 0;
      }

      info_ptr->num_text++;
      png_debug1(3, "transferred text chunk %d", info_ptr->num_text);
   }

   return(0);
}